

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::triml(basic_substring<const_char> *this,ro_substr chars)

{
  code *pcVar1;
  char *pcVar2;
  bool bVar3;
  size_t sVar4;
  basic_substring<const_char> bVar5;
  basic_substring<const_char> local_20;
  
  pcVar2 = this->str;
  if (this->str != (char *)0x0 && this->len != 0) {
    sVar4 = first_not_of(this,chars,0);
    if (sVar4 != 0xffffffffffffffff) {
      if (this->len < sVar4) {
        if (((byte)s_error_flags & 1) != 0) {
          bVar3 = is_debugger_attached();
          if (bVar3) {
            pcVar1 = (code *)swi(3);
            bVar5 = (basic_substring<const_char>)(*pcVar1)();
            return bVar5;
          }
        }
        handle_error(0x1ea013,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1533,"first >= 0 && first <= len");
      }
      basic_substring(&local_20,this->str + sVar4,this->len - sVar4);
      goto LAB_001da791;
    }
    pcVar2 = this->str;
  }
  local_20.str = pcVar2;
  local_20.len = 0;
LAB_001da791:
  bVar5.len = local_20.len;
  bVar5.str = local_20.str;
  return bVar5;
}

Assistant:

basic_substring triml(ro_substr chars) const
    {
        if( ! empty())
        {
            size_t pos = first_not_of(chars);
            if(pos != npos)
                return sub(pos);
        }
        return sub(0, 0);
    }